

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TextDisabledV(char *fmt,__va_list_tag *args)

{
  uint uVar1;
  long lVar2;
  uint *in_RSI;
  char *in_RDI;
  ImGuiContext *g;
  ImGuiTextFlags in_stack_000000f4;
  char *in_stack_000000f8;
  char *in_stack_00000100;
  undefined8 in_stack_ffffffffffffffd0;
  int count;
  ImGuiContext *args_00;
  
  count = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  args_00 = GImGui;
  PushStyleColor((ImGuiCol)((ulong)in_RSI >> 0x20),(ImVec4 *)GImGui);
  if (((*in_RDI == '%') && (in_RDI[1] == 's')) && (in_RDI[2] == '\0')) {
    uVar1 = *in_RSI;
    if (uVar1 < 0x29) {
      lVar2 = (long)(int)uVar1 + *(long *)(in_RSI + 4);
      *in_RSI = uVar1 + 8;
    }
    else {
      lVar2 = *(long *)(in_RSI + 2);
      *(long *)(in_RSI + 2) = lVar2 + 8;
    }
    count = (int)((ulong)lVar2 >> 0x20);
    TextEx(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  }
  else {
    TextV((char *)in_RSI,(__va_list_tag *)args_00);
  }
  PopStyleColor(count);
  return;
}

Assistant:

void ImGui::TextDisabledV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
    if (fmt[0] == '%' && fmt[1] == 's' && fmt[2] == 0)
        TextEx(va_arg(args, const char*), NULL, ImGuiTextFlags_NoWidthForLargeClippedText); // Skip formatting
    else
        TextV(fmt, args);
    PopStyleColor();
}